

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O1

void __thiscall Barrier::waitForFinish(Barrier *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->barrierMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->activitiesNumber).super___atomic_base<int>._M_i != 0) {
    do {
      std::condition_variable::wait((unique_lock *)&this->barrierCV);
    } while ((this->activitiesNumber).super___atomic_base<int>._M_i != 0);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void Barrier::waitForFinish () {
	std::unique_lock<std::mutex> lock (barrierMutex);
	barrierCV.wait (lock, [&] {return activitiesNumber == 0;});
}